

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ActionMessage.cpp
# Opt level: O0

vector<char,_std::allocator<char>_> * __thiscall
helics::ActionMessage::to_vector(ActionMessage *this)

{
  int iVar1;
  vector<char,_std::allocator<char>_> *in_RDI;
  int size;
  vector<char,_std::allocator<char>_> *data;
  size_t in_stack_00000048;
  byte *in_stack_00000050;
  ActionMessage *in_stack_00000058;
  undefined4 in_stack_ffffffffffffffdc;
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe8;
  uint3 in_stack_ffffffffffffffec;
  uint uVar2;
  
  uVar2 = (uint)in_stack_ffffffffffffffec;
  std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)0x5cac2f);
  iVar1 = serializedByteCount((ActionMessage *)CONCAT44(uVar2,in_stack_ffffffffffffffe8));
  std::vector<char,_std::allocator<char>_>::resize
            (in_stack_ffffffffffffffe0,CONCAT44(in_stack_ffffffffffffffdc,iVar1));
  std::vector<char,_std::allocator<char>_>::data((vector<char,_std::allocator<char>_> *)0x5cac62);
  toByteArray(in_stack_00000058,in_stack_00000050,in_stack_00000048);
  return in_RDI;
}

Assistant:

std::vector<char> ActionMessage::to_vector() const
{
    std::vector<char> data;
    auto size = serializedByteCount();
    data.resize(size);
    toByteArray(reinterpret_cast<std::byte*>(data.data()), size);
    return data;
}